

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
helics::make_cloning_filter(FilterTypes type,CoreApp *core,string_view delivery,string_view name)

{
  string_view name_00;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
  this;
  string_view delivery_00;
  size_t in_stack_00000008;
  char *in_stack_00000010;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this.super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>.
  _M_t.super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl._4_4_ = in_register_0000003c;
  this.super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>.
  _M_t.super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
  super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl._0_4_ = type;
  delivery_00._M_str = (char *)name._M_len;
  delivery_00._M_len = delivery._M_str;
  CLI::std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)delivery._M_len);
  name_00._M_str = in_stack_00000010;
  name_00._M_len = in_stack_00000008;
  make_cloning_filter((helics *)
                      this.
                      super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
                      .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl,
                      (FilterTypes)core,local_38._M_ptr,delivery_00,name_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_refcount);
  return (__uniq_ptr_data<helics::CloningFilter,_std::default_delete<helics::CloningFilter>,_true,_true>
          )(tuple<helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>)
           this.
           super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
           .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<CloningFilter> make_cloning_filter(FilterTypes type,
                                                   CoreApp& core,
                                                   std::string_view delivery,
                                                   std::string_view name)

{
    return make_cloning_filter(type, core.getCopyofCorePointer().get(), delivery, name);
}